

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh.c
# Opt level: O0

void run_centers_task(parallel_task_1d *task,size_t thread_id)

{
  real_t *prVar1;
  size_t sVar2;
  bbox bbox;
  vec3 point;
  real_t in_XMM1_Da;
  bbox local_68;
  undefined8 local_50;
  undefined8 local_40;
  vec3 center;
  size_t n;
  size_t i;
  centers_task *centers_task;
  size_t thread_id_local;
  parallel_task_1d *task_local;
  
  unique0x00012000 = (task->range).end;
  for (n = (task->range).begin; n < stack0xffffffffffffffd0; n = n + 1) {
    local_50 = (*task[1].work_item.work_fn)(task[1].work_item.next,n);
    sVar2 = task[1].range.begin;
    *(real_t *)(sVar2 + 8 + n * 0xc) = in_XMM1_Da;
    *(undefined8 *)(sVar2 + n * 0xc) = local_50;
    sVar2 = task[1].range.end;
    prVar1 = (real_t *)(sVar2 + thread_id * 0x18);
    point._[2] = in_XMM1_Da;
    point._[0] = (real_t)(int)local_50;
    point._[1] = (real_t)(int)((ulong)local_50 >> 0x20);
    bbox.max._._4_8_ = *(undefined8 *)(sVar2 + 0x10 + thread_id * 0x18);
    bbox._0_16_ = *(undefined1 (*) [16])(sVar2 + thread_id * 0x18);
    local_40 = local_50;
    extend_bbox(&local_68,bbox,point);
    *(undefined8 *)prVar1 = local_68.min._._0_8_;
    prVar1[2] = local_68.min._[2];
    prVar1[3] = local_68.max._[0];
    *(undefined8 *)(prVar1 + 4) = local_68.max._._4_8_;
  }
  return;
}

Assistant:

static void run_centers_task(struct parallel_task_1d* task, size_t thread_id) {
    struct centers_task* centers_task = (void*)task;
    for (size_t i = task->range.begin, n = task->range.end; i < n; ++i) {
        struct vec3 center = centers_task->center_fn(centers_task->primitive_data, i);
        centers_task->centers[i] = center;
        centers_task->center_bboxes[thread_id] = extend_bbox(centers_task->center_bboxes[thread_id], center);
    }
}